

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribute.c
# Opt level: O1

int distribute_start(mixed_segment *segment)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  ulong uVar7;
  
  plVar2 = (long *)segment->data;
  puVar3 = (undefined8 *)plVar2[2];
  if (puVar3 == (undefined8 *)0x0) {
    mixed_err(0x16);
    iVar6 = 0;
  }
  else {
    uVar1 = *(uint *)(plVar2 + 1);
    if ((ulong)uVar1 != 0) {
      lVar4 = *plVar2;
      uVar7 = 0;
      do {
        puVar5 = *(undefined8 **)(lVar4 + uVar7 * 8);
        *puVar5 = *puVar3;
        *(undefined4 *)(puVar5 + 1) = *(undefined4 *)(puVar3 + 1);
        *(undefined4 *)((long)puVar5 + 0xc) = *(undefined4 *)((long)puVar3 + 0xc);
        *(undefined4 *)(puVar5 + 2) = *(undefined4 *)(puVar3 + 2);
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    *(undefined4 *)(plVar2 + 3) = 0;
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int distribute_start(struct mixed_segment *segment){
  struct distribute_data *data = (struct distribute_data *)segment->data;
  struct mixed_buffer *in = data->in;

  if(!in){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }

  for(uint32_t i=0; i<data->count; ++i){
    struct mixed_buffer *buffer = data->out[i];
    buffer->_data = in->_data;
    buffer->size = in->size;
    buffer->read = in->read;
    buffer->write = in->write;
  }

  data->was_available = 0;
  return 1;
}